

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O1

void lzma_lzma_optimum_normal
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
               uint32_t position)

{
  lzma_match *matches;
  lzma_optimal *plVar1;
  byte bVar2;
  _Bool _Var3;
  byte bVar4;
  byte bVar5;
  short sVar6;
  ushort uVar7;
  ushort uVar8;
  long lVar9;
  ulong uVar10;
  lzma_mf *plVar11;
  uint32_t (*pauVar12) [272];
  uint uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  byte *pbVar17;
  ulong uVar18;
  short *psVar19;
  sbyte sVar20;
  int iVar21;
  byte *pbVar22;
  uint32_t *puVar23;
  lzma_lzma_state lVar24;
  lzma_lzma_state lVar25;
  uint uVar26;
  uint32_t i;
  uint uVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  uint32_t uVar31;
  uint uVar32;
  uint8_t *puVar33;
  uint uVar34;
  uint32_t (*pauVar35) [128];
  uint uVar36;
  undefined4 in_register_00000084;
  ulong uVar37;
  uint8_t *puVar38;
  uint uVar39;
  long lVar40;
  uint8_t *puVar41;
  ulong uVar42;
  uint uVar43;
  uint32_t (*pauVar44) [64];
  uint uVar45;
  uint uVar46;
  ulong uVar47;
  uint32_t model_index;
  ulong uVar48;
  bool bVar49;
  uint32_t reps [4];
  uint32_t matches_count;
  ulong local_198;
  uint local_148 [3];
  uint32_t uStack_13c;
  uint *local_138;
  uint32_t *local_130;
  uint8_t *local_128;
  uint local_120;
  uint32_t local_11c;
  lzma_mf *local_118;
  ulong local_110;
  uint8_t *local_108;
  uint32_t *local_100;
  ulong local_f8;
  uint local_f0;
  int local_ec;
  probability (*local_e8) [16];
  uint32_t (*local_e0) [272];
  long local_d8;
  long local_d0;
  ulong local_c8;
  uint32_t *local_c0;
  probability (*local_b8) [16];
  uint local_ac;
  ulong local_a8;
  undefined8 local_a0;
  ulong local_98;
  long local_90;
  uint8_t *local_88;
  uint32_t *local_80;
  uint32_t *local_78;
  ulong local_70;
  ushort *local_68;
  uint32_t (*local_60) [128];
  uint32_t (*local_58) [64];
  ulong local_50;
  long local_48;
  ulong local_40;
  uint32_t (*local_38) [272];
  
  local_a0 = CONCAT44(in_register_00000084,position);
  uVar27 = coder->opts_current_index;
  uVar14 = mf->read_ahead;
  local_138 = len_res;
  local_130 = back_res;
  local_118 = mf;
  if (coder->opts_end_index != uVar27) {
    if (uVar14 == 0) {
      __assert_fail("mf->read_ahead > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x327,
                    "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar14 = coder->opts[uVar27].pos_prev;
    uVar31 = coder->opts[uVar27].back_prev;
    coder->opts_current_index = uVar14;
    *len_res = uVar14 - uVar27;
    goto LAB_004ac089;
  }
  if (uVar14 == 0) {
    if (0x7f < coder->match_price_count) {
      pauVar35 = coder->dist_prices;
      puVar23 = coder->dist_slot_prices[0] + 0xe;
      lVar40 = 0;
      pauVar44 = coder->dist_slot_prices;
      do {
        if (coder->dist_table_size != 0) {
          uVar48 = 0;
          do {
            uVar31 = 0;
            uVar27 = (int)uVar48 + 0x40;
            do {
              uVar45 = uVar27 >> 1;
              uVar31 = uVar31 + lzma_rc_prices
                                [(-(uVar27 & 1) & 0x7f0 ^
                                 (uint)*(ushort *)
                                        ((long)coder->dist_slot[lVar40] +
                                        (ulong)(uVar27 & 0xfffffffe))) >> 4];
              uVar27 = uVar45;
            } while (uVar45 != 1);
            coder->dist_slot_prices[lVar40][uVar48] = uVar31;
            uVar48 = uVar48 + 1;
          } while (uVar48 < coder->dist_table_size);
        }
        if (0xe < coder->dist_table_size) {
          uVar27 = 0x70;
          lVar29 = 0;
          do {
            puVar23[lVar29] = ((uVar27 & 0xfffffff0) + puVar23[lVar29]) - 0x50;
            uVar48 = lVar29 + 0xf;
            uVar27 = uVar27 + 8;
            lVar29 = lVar29 + 1;
          } while (uVar48 < coder->dist_table_size);
        }
        lVar29 = 0;
        do {
          (*pauVar35)[lVar29] = (*pauVar44)[lVar29];
          lVar29 = lVar29 + 1;
        } while (lVar29 != 4);
        lVar40 = lVar40 + 1;
        puVar23 = puVar23 + 0x40;
        pauVar35 = pauVar35 + 1;
        pauVar44 = pauVar44 + 1;
      } while (lVar40 != 4);
      puVar23 = coder->dist_prices[0] + 4;
      lVar40 = 4;
      do {
        bVar2 = ""[lVar40];
        iVar21 = (bVar2 >> 1) - 1;
        uVar45 = (bVar2 & 1 | 2) << ((byte)iVar21 & 0x1f);
        uVar32 = (int)lVar40 - uVar45;
        uVar27 = 1;
        iVar28 = 0;
        do {
          uVar13 = uVar32 & 1;
          uVar48 = (ulong)uVar27;
          uVar27 = uVar13 + uVar27 * 2;
          uVar32 = uVar32 >> 1;
          iVar28 = iVar28 + (uint)lzma_rc_prices
                                  [(-uVar13 & 0x7f0 ^
                                   (uint)*(ushort *)
                                          ((long)coder +
                                          uVar48 * 2 +
                                          ((ulong)uVar45 * 2 - (ulong)((uint)bVar2 + (uint)bVar2)) +
                                          0x70fa)) >> 4];
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
        lVar29 = 0;
        do {
          *(int *)((long)puVar23 + lVar29 * 2) =
               *(int *)((long)coder->dist_slot_prices[0] + lVar29 + (ulong)bVar2 * 4) + iVar28;
          lVar29 = lVar29 + 0x100;
        } while (lVar29 != 0x400);
        lVar40 = lVar40 + 1;
        puVar23 = puVar23 + 1;
      } while (lVar40 != 0x80);
      coder->match_price_count = 0;
    }
    if (0xf < coder->align_price_count) {
      uVar48 = 0;
      do {
        uVar27 = 1;
        iVar21 = -4;
        uVar47 = uVar48 & 0xffffffff;
        uVar31 = 0;
        do {
          uVar45 = (uint)uVar47 & 1;
          uVar18 = (ulong)uVar27;
          uVar27 = uVar45 + uVar27 * 2;
          uVar47 = uVar47 >> 1;
          uVar31 = uVar31 + lzma_rc_prices[(-uVar45 & 0x7f0 ^ (uint)coder->dist_align[uVar18]) >> 4]
          ;
          iVar21 = iVar21 + 1;
        } while (iVar21 != 0);
        coder->align_prices[uVar48] = uVar31;
        uVar48 = uVar48 + 1;
      } while (uVar48 != 0x10);
      coder->align_price_count = 0;
    }
  }
  uVar27 = mf->nice_len;
  if (uVar14 == 1) {
    local_11c = coder->matches_count;
    uVar14 = coder->longest_match_length;
  }
  else {
    if (uVar14 != 0) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x11c,
                    "uint32_t helper1(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar14 = lzma_mf_find(mf,&local_11c,coder->matches);
  }
  plVar11 = local_118;
  uVar45 = mf->read_pos;
  uVar13 = (mf->write_pos - uVar45) + 1;
  uVar32 = 0x111;
  if (uVar13 < 0x111) {
    uVar32 = uVar13;
  }
  if (uVar13 < 2) {
    *local_130 = 0xffffffff;
LAB_004aad5b:
    *local_138 = 1;
    local_198 = 0xffffffff;
  }
  else {
    puVar33 = mf->buffer;
    pbVar22 = puVar33 + ((ulong)uVar45 - 1);
    pbVar17 = puVar33 + ((ulong)uVar45 - 2);
    sVar6 = *(short *)(puVar33 + ((ulong)uVar45 - 1));
    lVar40 = 0;
    uVar45 = 0;
    do {
      uVar48 = (ulong)coder->reps[lVar40];
      lVar29 = -uVar48;
      if (sVar6 == *(short *)(pbVar17 + lVar29)) {
        uVar13 = 2;
        do {
          uVar34 = uVar32;
          if (uVar32 <= uVar13) break;
          uVar18 = (ulong)uVar13;
          lVar9 = *(long *)(pbVar17 + lVar29 + uVar13);
          uVar47 = *(long *)(pbVar22 + uVar18) - lVar9;
          if (uVar47 == 0) {
            uVar13 = uVar13 + 8;
          }
          else {
            uVar48 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
              }
            }
            uVar13 = ((uint)(uVar48 >> 3) & 0x1fffffff) + uVar13;
            if (uVar13 < uVar32) {
              uVar34 = uVar13;
            }
            uVar48 = (ulong)uVar34;
          }
          uVar34 = (uint)uVar48;
        } while (*(long *)(pbVar22 + uVar18) == lVar9);
        local_148[lVar40] = uVar34;
        if (local_148[uVar45] < uVar34) {
          uVar45 = (uint)lVar40;
        }
      }
      else {
        local_148[lVar40] = 0;
      }
      lVar40 = lVar40 + 1;
    } while (lVar40 != 4);
    uVar32 = local_148[uVar45];
    if (uVar32 < uVar27) {
      if (uVar14 < uVar27) {
        bVar2 = *pbVar22;
        bVar4 = pbVar22[~(ulong)coder->reps[0]];
        if (((uVar32 < 2) && (uVar14 < 2)) && (bVar2 != bVar4)) {
          *local_130 = 0xffffffff;
          *local_138 = 1;
          local_198 = 0xffffffff;
        }
        else {
          uVar47 = (ulong)coder->state;
          coder->opts[0].state = coder->state;
          uVar27 = coder->pos_mask & (uint)local_a0;
          uVar48 = (ulong)(coder->is_match[uVar47][uVar27] >> 4);
          local_108 = (uint8_t *)CONCAT44(local_108._4_4_,(uint)lzma_rc_prices[uVar48]);
          uVar31 = get_literal_price(coder,(uint)local_a0,(uint)*pbVar17,6 < uVar47,(uint)bVar4,
                                     (uint)bVar2);
          coder->opts[1].price = uVar31 + (int)local_108;
          coder->opts[1].back_prev = 0xffffffff;
          coder->opts[1].prev_1_is_literal = false;
          bVar5 = lzma_rc_prices[uVar48 ^ 0x7f];
          puVar33 = (uint8_t *)(ulong)(coder->is_rep[uVar47] >> 4);
          iVar21 = (uint)lzma_rc_prices[(ulong)puVar33 ^ 0x7f] + (uint)bVar5;
          if ((bVar2 == bVar4) &&
             (uVar45 = (uint)lzma_rc_prices[coder->is_rep0_long[uVar47][uVar27] >> 4] +
                       (uint)lzma_rc_prices[coder->is_rep0[uVar47] >> 4] + iVar21,
             uVar45 < uVar31 + (int)local_108)) {
            coder->opts[1].price = uVar45;
            coder->opts[1].back_prev = 0;
            coder->opts[1].prev_1_is_literal = false;
          }
          if (uVar32 < uVar14) {
            uVar32 = uVar14;
          }
          local_198 = (ulong)uVar32;
          if (uVar32 < 2) {
            *local_130 = coder->opts[1].back_prev;
            goto LAB_004aad5b;
          }
          coder->opts[1].pos_prev = 0;
          lVar40 = 0;
          do {
            coder->opts[0].backs[lVar40] = coder->reps[lVar40];
            lVar40 = lVar40 + 1;
          } while (lVar40 != 4);
          puVar23 = &coder->opts[local_198].price;
          uVar48 = local_198;
          do {
            *puVar23 = 0x40000000;
            uVar45 = (int)uVar48 - 1;
            uVar48 = (ulong)uVar45;
            puVar23 = puVar23 + -0xb;
          } while (1 < uVar45);
          lVar40 = 0;
          do {
            uVar45 = local_148[lVar40];
            if (1 < uVar45) {
              uVar48 = (ulong)(coder->is_rep0[uVar47] >> 4);
              if (lVar40 == 0) {
                uVar32 = (uint)lzma_rc_prices[uVar48];
                bVar2 = lzma_rc_prices[(ulong)(coder->is_rep0_long[uVar47][uVar27] >> 4) ^ 0x7f];
LAB_004ac306:
                iVar28 = bVar2 + uVar32;
              }
              else {
                uVar18 = (ulong)(coder->is_rep1[uVar47] >> 4);
                if (lVar40 != 1) {
                  uVar32 = (uint)lzma_rc_prices[uVar18 ^ 0x7f] + (uint)lzma_rc_prices[uVar48 ^ 0x7f]
                  ;
                  bVar2 = lzma_rc_prices
                          [(2 - (uint32_t)lVar40 & 0x7f0 ^ (uint)coder->is_rep2[uVar47]) >> 4];
                  goto LAB_004ac306;
                }
                iVar28 = (uint)lzma_rc_prices[uVar18] + (uint)lzma_rc_prices[uVar48 ^ 0x7f];
              }
              puVar23 = (coder->rep_len_encoder).prices[uVar27] + (uVar45 - 2);
              do {
                uVar32 = *puVar23 + iVar28 + iVar21;
                if (uVar32 < coder->opts[uVar45].price) {
                  coder->opts[uVar45].price = uVar32;
                  coder->opts[uVar45].pos_prev = 0;
                  coder->opts[uVar45].back_prev = (uint32_t)lVar40;
                  coder->opts[uVar45].prev_1_is_literal = false;
                }
                uVar45 = uVar45 - 1;
                puVar23 = puVar23 + -1;
              } while (1 < uVar45);
            }
            lVar40 = lVar40 + 1;
          } while (lVar40 != 4);
          uVar48 = 2;
          if (1 < local_148[0]) {
            uVar48 = (ulong)(local_148[0] + 1);
          }
          local_108 = puVar33;
          if ((uint)uVar48 <= uVar14) {
            bVar2 = lzma_rc_prices[(long)puVar33];
            uVar47 = 0xffffffff;
            do {
              uVar47 = (ulong)((int)uVar47 + 1);
            } while (coder->matches[uVar47].len < (uint)uVar48);
            while( true ) {
              uVar45 = coder->matches[uVar47].dist;
              uVar32 = (uint)uVar48;
              uVar13 = 3;
              if (uVar32 < 6) {
                uVar13 = uVar32 - 2;
              }
              if ((ulong)uVar45 < 0x80) {
                uVar14 = coder->dist_prices[uVar13][uVar45];
              }
              else {
                sVar20 = 0x1e;
                if (-1 < (int)uVar45) {
                  sVar20 = 0x12;
                }
                iVar21 = 0x3c;
                if (-1 < (int)uVar45) {
                  iVar21 = 0x24;
                }
                if (uVar45 < 0x80000) {
                  sVar20 = 6;
                }
                if (uVar45 < 0x80000) {
                  iVar21 = 0xc;
                }
                uVar14 = coder->align_prices[uVar45 & 0xf] +
                         coder->dist_slot_prices[uVar13][(uint)""[uVar45 >> sVar20] + iVar21];
              }
              uVar13 = uVar14 + (uint)bVar2 + (uint)bVar5 +
                       (coder->match_len_encoder).prices[uVar27][uVar32 - 2];
              if (uVar13 < coder->opts[uVar48].price) {
                coder->opts[uVar48].price = uVar13;
                coder->opts[uVar48].pos_prev = 0;
                coder->opts[uVar48].back_prev = uVar45 + 4;
                coder->opts[uVar48].prev_1_is_literal = false;
              }
              uVar45 = coder->matches[uVar47].len;
              uVar13 = (int)uVar47 + 1;
              if ((uVar32 == uVar45) && (uVar13 == local_11c)) break;
              uVar18 = (ulong)uVar13;
              if (uVar32 != uVar45) {
                uVar18 = uVar47;
              }
              uVar48 = (ulong)(uVar32 + 1);
              uVar47 = uVar18;
            }
          }
        }
      }
      else {
        *local_130 = coder->matches[local_11c - 1].dist + 4;
        *local_138 = uVar14;
        local_198 = 0xffffffff;
        uVar14 = uVar14 - 1;
        if (uVar14 != 0) {
          (*local_118->skip)(local_118,uVar14);
          local_198 = 0xffffffff;
          puVar23 = &plVar11->read_ahead;
          *puVar23 = *puVar23 + uVar14;
        }
      }
    }
    else {
      *local_130 = uVar45;
      *local_138 = uVar32;
      local_198 = 0xffffffff;
      uVar14 = uVar32 - 1;
      if (uVar14 != 0) {
        (*local_118->skip)(local_118,uVar14);
        local_198 = 0xffffffff;
        puVar23 = &plVar11->read_ahead;
        *puVar23 = *puVar23 + uVar14;
      }
    }
  }
  if ((uint)local_198 == 0xffffffff) {
    return;
  }
  local_148[0] = (uint)*(undefined8 *)coder->reps;
  local_148[1] = (uint)((ulong)*(undefined8 *)coder->reps >> 0x20);
  local_148[2] = (uint)*(undefined8 *)(coder->reps + 2);
  uStack_13c = (uint32_t)((ulong)*(undefined8 *)(coder->reps + 2) >> 0x20);
  uVar48 = 1;
  if (1 < (uint)local_198) {
    local_80 = &coder->matches_count;
    matches = coder->matches;
    local_e8 = coder->is_match;
    local_b8 = coder->is_rep0_long;
    local_e0 = (coder->rep_len_encoder).prices;
    local_38 = (coder->match_len_encoder).prices;
    local_58 = coder->dist_slot_prices;
    local_60 = coder->dist_prices;
    local_c0 = coder->opts[0].backs;
    local_78 = coder->opts[1].backs;
    local_100 = &coder->opts[1].price;
    local_110 = 0xffe;
    lVar40 = 0;
    uVar48 = 1;
    do {
      puVar23 = local_80;
      plVar11 = local_118;
      if (lVar40 == 0xfff) {
        __assert_fail("cur < OPTS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                      ,0x348,
                      "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                     );
      }
      uVar14 = lzma_mf_find(local_118,local_80,matches);
      local_70 = (ulong)uVar14;
      coder->longest_match_length = uVar14;
      local_f8 = (ulong)plVar11->nice_len;
      if (plVar11->nice_len <= uVar14) break;
      puVar33 = (uint8_t *)(ulong)plVar11->read_pos;
      local_f0 = (plVar11->write_pos - plVar11->read_pos) + 1;
      uVar14 = (uint32_t)uVar48;
      uVar27 = 0xfff - uVar14;
      if (local_f0 < 0xfff - uVar14) {
        uVar27 = local_f0;
      }
      plVar1 = coder->opts + uVar48;
      uVar45 = coder->opts[uVar48].pos_prev;
      uVar47 = (ulong)uVar45;
      _Var3 = coder->opts[uVar48].prev_1_is_literal;
      if (_Var3 == true) {
        uVar45 = uVar45 - 1;
        uVar47 = (ulong)uVar45;
        if (plVar1->prev_2 == true) {
          lVar25 = coder->opts[plVar1->pos_prev_2].state;
          if (plVar1->back_prev_2 < 4) {
            lVar24 = (uint)(STATE_SHORTREP_LIT < lVar25) * 3 + STATE_LIT_LONGREP;
          }
          else {
            lVar24 = (uint)(STATE_SHORTREP_LIT < lVar25) * 3 + STATE_LIT_MATCH;
          }
        }
        else {
          lVar24 = coder->opts[uVar45].state;
        }
        lVar25 = (lVar24 - STATE_SHORTREP_LIT) + (uint)(lVar24 < STATE_NONLIT_MATCH) * 3;
        if (lVar24 < STATE_MATCH_LIT) {
          lVar25 = STATE_LIT_LIT;
        }
      }
      else {
        lVar25 = coder->opts[uVar47].state;
      }
      puVar41 = plVar11->buffer;
      local_120 = *puVar23;
      local_90 = lVar40;
      if (uVar48 - 1 == uVar47) {
        if (plVar1->back_prev == 0) {
          lVar24 = (uint)(STATE_SHORTREP_LIT < lVar25) * 2 + STATE_LIT_SHORTREP;
        }
        else {
          lVar24 = (lVar25 - STATE_SHORTREP_LIT) + (uint)(lVar25 < STATE_NONLIT_MATCH) * 3;
          if (lVar25 < STATE_MATCH_LIT) {
            lVar24 = STATE_LIT_LIT;
          }
        }
      }
      else {
        if ((_Var3 == false) || (plVar1->prev_2 != true)) {
          uVar45 = plVar1->back_prev;
          if (uVar45 < 4) goto LAB_004ab150;
          lVar24 = (uint)(STATE_SHORTREP_LIT < lVar25) * 3 + STATE_LIT_MATCH;
        }
        else {
          uVar47 = (ulong)plVar1->pos_prev_2;
          uVar45 = plVar1->back_prev_2;
LAB_004ab150:
          lVar24 = (uint)(STATE_SHORTREP_LIT < lVar25) * 3 + STATE_LIT_LONGREP;
        }
        if (uVar45 < 4) {
          local_148[0] = coder->opts[uVar47].backs[uVar45];
          if (uVar45 == 0) {
            uVar18 = 1;
          }
          else {
            uVar18 = (ulong)(uVar45 + 1);
            memcpy(local_148 + 1,local_c0 + uVar47 * 0xb,uVar18 * 4 - 4);
          }
          puVar23 = local_c0;
          if ((uint)uVar18 < 4) {
            do {
              local_148[uVar18] = puVar23[uVar47 * 0xb + uVar18];
              uVar18 = uVar18 + 1;
            } while ((int)uVar18 != 4);
          }
        }
        else {
          local_148[0] = uVar45 - 4;
          uStack_13c = local_c0[uVar47 * 0xb + 2];
          local_148[1] = (uint)*(undefined8 *)(local_c0 + uVar47 * 0xb);
          local_148[2] = (uint)((ulong)*(undefined8 *)(local_c0 + uVar47 * 0xb) >> 0x20);
        }
      }
      puVar23 = local_78 + local_90 * 0xb;
      local_88 = puVar41 + (long)puVar33;
      uVar32 = uVar14 + (int)local_a0;
      local_c8 = (ulong)uVar32;
      plVar1->state = lVar24;
      *puVar23 = local_148[0];
      *(ulong *)(puVar23 + 1) = CONCAT44(local_148[2],local_148[1]);
      puVar23[3] = uStack_13c;
      uVar31 = plVar1->price;
      bVar2 = local_88[-1];
      uVar37 = (ulong)local_148[0];
      bVar4 = local_88[-2 - uVar37];
      uVar45 = coder->pos_mask;
      uVar18 = (ulong)(uVar45 & uVar32);
      uVar47 = (ulong)lVar24;
      local_d8 = uVar47 * 0x20;
      uVar30 = (ulong)(local_e8[uVar47][uVar18] >> 4);
      bVar5 = lzma_rc_prices[uVar30];
      local_128 = puVar41;
      uVar15 = get_literal_price(coder,uVar32,(uint)local_88[-2],STATE_SHORTREP_LIT < lVar24,
                                 (uint)bVar4,(uint)bVar2);
      pauVar12 = local_e0;
      uVar32 = uVar15 + uVar31 + (uint)bVar5;
      local_98 = uVar48 + 1;
      bVar49 = uVar32 < coder->opts[uVar48 + 1].price;
      if (bVar49) {
        coder->opts[uVar48 + 1].price = uVar32;
        coder->opts[uVar48 + 1].pos_prev = uVar14;
        coder->opts[uVar48 + 1].back_prev = 0xffffffff;
        coder->opts[uVar48 + 1].prev_1_is_literal = false;
      }
      local_ec = uVar31 + lzma_rc_prices[uVar30 ^ 0x7f];
      uVar30 = (ulong)(coder->is_rep[uVar47] >> 4);
      local_d0 = CONCAT44(local_d0._4_4_,(uint)lzma_rc_prices[uVar30 ^ 0x7f] + local_ec);
      if ((bVar4 == bVar2) &&
         (((uVar48 <= coder->opts[uVar48 + 1].pos_prev || (coder->opts[uVar48 + 1].back_prev != 0))
          && (uVar13 = (uint)lzma_rc_prices
                             [*(ushort *)((long)*local_b8 + uVar18 * 2 + local_d8) >> 4] +
                       (uint)lzma_rc_prices[coder->is_rep0[uVar47] >> 4] +
                       (uint)lzma_rc_prices[uVar30 ^ 0x7f] + local_ec,
             uVar13 <= coder->opts[uVar48 + 1].price)))) {
        coder->opts[uVar48 + 1].price = uVar13;
        coder->opts[uVar48 + 1].pos_prev = uVar14;
        coder->opts[uVar48 + 1].back_prev = 0;
        coder->opts[uVar48 + 1].prev_1_is_literal = false;
        bVar49 = true;
      }
      local_110 = local_110 & 0xffffffff;
      if (1 < uVar27) {
        puVar41 = local_128 + (long)puVar33 + -1;
        uVar34 = (uint)local_f8;
        uVar13 = uVar34;
        if (uVar27 < uVar34) {
          uVar13 = uVar27;
        }
        local_a8 = uVar30;
        if (bVar4 != bVar2 && !bVar49) {
          uVar26 = uVar34 + 1;
          if (uVar27 <= uVar34 + 1) {
            uVar26 = uVar27;
          }
          if (uVar34 + 1 == 0) {
LAB_004ac4d4:
            __assert_fail("len <= limit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                          ,0x2e,
                          "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                         );
          }
          uVar39 = 1;
          uVar34 = uVar34 + 1;
          do {
            uVar43 = uVar26;
            if (uVar26 <= uVar39) break;
            uVar48 = (ulong)uVar39;
            uVar30 = (ulong)uVar39;
            uVar42 = *(long *)(puVar41 + uVar48) - *(long *)(puVar41 + uVar30 + ~uVar37);
            if (uVar42 == 0) {
              uVar39 = uVar39 + 8;
              uVar43 = uVar34;
            }
            else {
              uVar10 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar39 = ((uint)(uVar10 >> 3) & 0x1fffffff) + uVar39;
              if (uVar39 < uVar26) {
                uVar43 = uVar39;
              }
            }
            uVar34 = uVar43;
          } while (*(long *)(puVar41 + uVar48) == *(long *)(puVar41 + uVar30 + ~uVar37));
          if (uVar43 - 3 < 0xfffffffe) {
            uVar34 = (lVar24 - STATE_SHORTREP_LIT) + (uint)(lVar24 < STATE_NONLIT_MATCH) * 3;
            if (lVar24 < STATE_MATCH_LIT) {
              uVar34 = 0;
            }
            uVar39 = (int)local_c8 + 1U & uVar45;
            uVar7 = local_e8[uVar34][uVar39];
            uVar8 = coder->is_rep[uVar34];
            uVar26 = uVar43 + uVar14;
            if ((uint)local_198 < uVar26) {
              puVar23 = local_100 + local_198 * 0xb;
              lVar40 = 0;
              do {
                *puVar23 = 0x40000000;
                lVar40 = lVar40 + -1;
                puVar23 = puVar23 + 0xb;
              } while (local_198 - (uVar43 + uVar14) != lVar40);
              local_198 = (ulong)((uint)local_198 - (int)lVar40);
            }
            uVar32 = uVar32 + lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                     (uint)lzma_rc_prices[(ulong)(uVar8 >> 4) ^ 0x7f] + local_e0[uVar39][uVar43 - 3]
                     + (uint)lzma_rc_prices[coder->is_rep0[uVar34] >> 4] +
                     (uint)lzma_rc_prices[(ulong)(local_b8[uVar34][uVar39] >> 4) ^ 0x7f];
            if (uVar32 < coder->opts[uVar26].price) {
              coder->opts[uVar26].price = uVar32;
              coder->opts[uVar26].pos_prev = (uint32_t)local_98;
              coder->opts[uVar26].back_prev = 0;
              coder->opts[uVar26].prev_1_is_literal = true;
              coder->opts[uVar26].prev_2 = false;
            }
          }
        }
        local_108 = local_88 + -2;
        sVar6 = *(short *)(local_128 + -1 + (long)puVar33);
        local_68 = (ushort *)((long)*local_b8 + uVar18 * 2 + local_d8);
        local_d8 = uVar18 * 0x440;
        local_50 = (ulong)local_f0;
        uVar32 = 2;
        local_48 = (long)*local_e8 + (ulong)(((uint)(STATE_SHORTREP_LIT < lVar24) * 3 + 8) * 0x20);
        lVar40 = 0;
        do {
          uVar34 = local_148[lVar40];
          psVar19 = (short *)(local_108 + -(ulong)uVar34);
          if (sVar6 == *psVar19) {
            if (uVar13 < 2) goto LAB_004ac4d4;
            uVar26 = 2;
            do {
              if (uVar13 <= uVar26) {
                puVar33 = (uint8_t *)(ulong)uVar13;
                break;
              }
              uVar48 = (ulong)uVar26;
              lVar29 = *(long *)((long)psVar19 + uVar48);
              uVar37 = *(long *)(puVar41 + uVar48) - lVar29;
              if (uVar37 == 0) {
                uVar26 = uVar26 + 8;
              }
              else {
                uVar30 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar26 = ((uint)(uVar30 >> 3) & 0x1fffffff) + uVar26;
                uVar39 = uVar13;
                if (uVar26 < uVar13) {
                  uVar39 = uVar26;
                }
                puVar33 = (uint8_t *)(ulong)uVar39;
              }
            } while (*(long *)(puVar41 + uVar48) == lVar29);
            iVar21 = (int)puVar33;
            local_128 = (uint8_t *)(ulong)(uVar14 + iVar21);
            if ((uint)local_198 < uVar14 + iVar21) {
              puVar23 = local_100 + local_198 * 0xb;
              lVar29 = 0;
              do {
                *puVar23 = 0x40000000;
                lVar29 = lVar29 + -1;
                puVar23 = puVar23 + 0xb;
              } while (local_198 - (uVar14 + iVar21) != lVar29);
              local_198 = (ulong)((uint)local_198 - (int)lVar29);
            }
            uVar7 = coder->is_rep0[uVar47] >> 4;
            uVar31 = (uint32_t)lVar40;
            if (lVar40 == 0) {
              bVar2 = lzma_rc_prices[uVar7];
              uVar48 = (ulong)(*local_68 >> 4) ^ 0x7f;
LAB_004ab838:
              iVar28 = (uint)lzma_rc_prices[uVar48] + (uint)bVar2;
            }
            else {
              bVar2 = lzma_rc_prices[(ulong)uVar7 ^ 0x7f];
              uVar7 = coder->is_rep1[uVar47] >> 4;
              uVar48 = (ulong)uVar7;
              if (lVar40 == 1) goto LAB_004ab838;
              iVar28 = (uint)lzma_rc_prices
                             [(2 - uVar31 & 0x7f0 ^ (uint)coder->is_rep2[uVar47]) >> 4] +
                       (uint)lzma_rc_prices[(ulong)uVar7 ^ 0x7f] + (uint)bVar2;
            }
            iVar28 = iVar28 + (int)local_d0;
            puVar23 = pauVar12[uVar18] + (iVar21 - 2U);
            puVar38 = puVar33;
            do {
              uVar26 = *puVar23 + iVar28;
              uVar39 = uVar14 + (int)puVar38;
              if (uVar26 < coder->opts[uVar39].price) {
                coder->opts[uVar39].price = uVar26;
                coder->opts[uVar39].pos_prev = uVar14;
                coder->opts[uVar39].back_prev = uVar31;
                coder->opts[uVar39].prev_1_is_literal = false;
              }
              uVar26 = (int)puVar38 - 1;
              puVar38 = (uint8_t *)(ulong)uVar26;
              puVar23 = puVar23 + -1;
            } while (1 < uVar26);
            uVar26 = iVar21 + 1;
            if (lVar40 == 0) {
              uVar32 = uVar26;
            }
            uVar43 = (int)local_f8 + iVar21 + 1;
            uVar39 = uVar27;
            if (uVar43 < uVar27) {
              uVar39 = uVar43;
            }
            uVar36 = uVar26;
            if (uVar26 < uVar39) {
              puVar38 = local_88 + uVar26;
              uVar48 = (ulong)uVar43;
              if (local_110 < uVar43) {
                uVar48 = local_110;
              }
              if (local_50 <= uVar48) {
                uVar48 = local_50;
              }
              lVar29 = uVar48 - uVar26;
              uVar43 = uVar26;
              do {
                uVar36 = uVar43;
                if (puVar38[-1] != puVar38[-2 - (ulong)uVar34]) break;
                uVar43 = uVar43 + 1;
                puVar38 = puVar38 + 1;
                lVar29 = lVar29 + -1;
                uVar36 = uVar39;
              } while (lVar29 != 0);
            }
            if (1 < uVar36 - uVar26) {
              uVar34 = (int)local_c8 + iVar21;
              uVar15 = pauVar12[uVar18][iVar21 - 2U];
              local_ac = (uint)lzma_rc_prices
                               [*(ushort *)(local_48 + (ulong)(uVar34 & uVar45) * 2) >> 4];
              local_40 = (ulong)(uVar36 - uVar26);
              uVar16 = get_literal_price(coder,uVar34,(uint)puVar41[iVar21 - 1],true,
                                         (uint)*(byte *)((long)psVar19 + (long)puVar33),
                                         (uint)puVar41[(long)puVar33]);
              uVar26 = (int)local_c8 + iVar21 + 1U & uVar45;
              uVar7 = coder->is_match[5][uVar26];
              uVar8 = coder->is_rep[5];
              uVar34 = (int)local_128 + (int)local_40 + 1;
              if ((uint)local_198 < uVar34) {
                puVar23 = local_100 + local_198 * 0xb;
                lVar29 = 0;
                do {
                  *puVar23 = 0x40000000;
                  lVar29 = lVar29 + -1;
                  puVar23 = puVar23 + 0xb;
                } while (local_198 - (uVar36 + uVar14) != lVar29);
                local_198 = (ulong)((uint)local_198 - (int)lVar29);
              }
              puVar33 = lzma_rc_prices;
              uVar26 = uVar15 + iVar28 + local_ac + uVar16 +
                       (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                       (uint)lzma_rc_prices[(ulong)(uVar8 >> 4) ^ 0x7f] +
                       local_e0[uVar26][(int)local_40 - 2] +
                       (uint)lzma_rc_prices[coder->is_rep0[5] >> 4] +
                       (uint)lzma_rc_prices[(ulong)(coder->is_rep0_long[5][uVar26] >> 4) ^ 0x7f];
              if (uVar26 < coder->opts[uVar34].price) {
                coder->opts[uVar34].price = uVar26;
                coder->opts[uVar34].pos_prev = (int)local_128 + 1;
                coder->opts[uVar34].back_prev = 0;
                coder->opts[uVar34].prev_1_is_literal = true;
                coder->opts[uVar34].prev_2 = true;
                coder->opts[uVar34].pos_prev_2 = uVar14;
                coder->opts[uVar34].back_prev_2 = uVar31;
              }
            }
          }
          lVar40 = lVar40 + 1;
        } while (lVar40 != 4);
        uVar34 = (uint)local_70;
        uVar26 = local_120;
        uVar39 = uVar34;
        if (uVar13 < uVar34) {
          uVar26 = 0;
          do {
            uVar39 = uVar26;
            uVar26 = uVar39 + 1;
          } while (matches[uVar39].len < uVar13);
          matches[uVar39].len = uVar13;
          uVar39 = uVar13;
        }
        if (uVar32 <= uVar39) {
          uVar13 = (uint)local_f8;
          if ((uint)local_198 < uVar39 + uVar14) {
            if (uVar13 <= uVar34) {
              uVar34 = uVar13;
            }
            if ((uint)local_110 <= uVar34) {
              uVar34 = (uint)local_110;
            }
            if (local_f0 <= uVar34) {
              uVar34 = local_f0;
            }
            puVar23 = local_100 + local_198 * 0xb;
            lVar40 = 0;
            do {
              *puVar23 = 0x40000000;
              lVar40 = lVar40 + -1;
              puVar23 = puVar23 + 0xb;
            } while (local_198 - (uVar34 + uVar14) != lVar40);
            local_198 = (ulong)((uint)local_198 - (int)lVar40);
          }
          uVar48 = 0xffffffff;
          do {
            uVar48 = (ulong)((int)uVar48 + 1);
          } while (matches[uVar48].len < uVar32);
          local_ec = local_ec + (uint)lzma_rc_prices[local_a8];
          uVar13 = uVar13 + uVar32;
          local_d0 = (long)*local_e8 + (ulong)(((uint)(STATE_SHORTREP_LIT < lVar24) * 3 + 7) * 0x20)
          ;
          local_120 = uVar26;
          do {
            uVar13 = uVar13 + 1;
            uVar34 = uVar13;
            if (uVar27 < uVar13) {
              uVar34 = uVar27;
            }
            uVar26 = coder->matches[uVar48].dist;
            puVar33 = (uint8_t *)(ulong)uVar26;
            uVar39 = 3;
            if (uVar32 < 6) {
              uVar39 = uVar32 - 2;
            }
            if (puVar33 < (uint8_t *)0x80) {
              uVar31 = local_60[uVar39][(long)puVar33];
            }
            else {
              sVar20 = 0x1e;
              if (-1 < (int)uVar26) {
                sVar20 = 0x12;
              }
              iVar21 = 0x3c;
              if (-1 < (int)uVar26) {
                iVar21 = 0x24;
              }
              if (uVar26 < 0x80000) {
                sVar20 = 6;
                iVar21 = 0xc;
              }
              uVar31 = coder->align_prices[uVar26 & 0xf] +
                       local_58[uVar39][(uint)""[uVar26 >> sVar20] + iVar21];
            }
            uVar43 = uVar31 + local_ec +
                     *(int *)((long)*local_38 + (ulong)(uVar32 - 2) * 4 + local_d8);
            uVar39 = uVar32 + uVar14;
            if (uVar43 < coder->opts[uVar39].price) {
              coder->opts[uVar39].price = uVar43;
              coder->opts[uVar39].pos_prev = uVar14;
              coder->opts[uVar39].back_prev = uVar26 + 4;
              coder->opts[uVar39].prev_1_is_literal = false;
            }
            uVar47 = (ulong)(uVar32 + 1);
            bVar49 = true;
            if (uVar32 == matches[uVar48].len) {
              uVar36 = uVar32 + 1;
              uVar26 = (int)local_f8 + uVar32 + 1;
              if (uVar27 <= uVar26) {
                uVar26 = uVar27;
              }
              uVar46 = uVar36;
              if (uVar36 < uVar26) {
                do {
                  if (puVar41[uVar47] != local_108[uVar47 - (long)puVar33]) goto LAB_004abdae;
                  uVar47 = uVar47 + 1;
                } while (uVar47 < uVar26);
                uVar47 = (ulong)uVar34;
LAB_004abdae:
                uVar46 = (uint)uVar47;
              }
              uVar36 = uVar46 - uVar36;
              local_128 = puVar33;
              if (1 < uVar36) {
                uVar34 = uVar32 + (int)local_c8;
                uVar26 = uVar34 & uVar45;
                bVar2 = lzma_rc_prices[*(ushort *)(local_d0 + (ulong)uVar26 * 2) >> 4];
                uVar31 = get_literal_price(coder,uVar34,(uint)puVar41[uVar32 - 1],true,
                                           (uint)local_108[(ulong)uVar32 - (long)puVar33],
                                           (uint)puVar41[uVar32]);
                uVar26 = uVar26 + 1 & uVar45;
                uVar7 = coder->is_match[4][uVar26];
                uVar8 = coder->is_rep[4];
                uVar34 = uVar39 + uVar36 + 1;
                if ((uint)local_198 < uVar34) {
                  puVar23 = local_100 + local_198 * 0xb;
                  lVar40 = 0;
                  do {
                    *puVar23 = 0x40000000;
                    lVar40 = lVar40 + -1;
                    puVar23 = puVar23 + 0xb;
                  } while (local_198 - (uVar46 + uVar14) != lVar40);
                  local_198 = (ulong)((uint)local_198 - (int)lVar40);
                }
                uVar26 = uVar43 + bVar2 + uVar31 + (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f]
                         + (uint)lzma_rc_prices[(ulong)(uVar8 >> 4) ^ 0x7f] +
                         local_e0[uVar26][uVar36 - 2] + (uint)lzma_rc_prices[coder->is_rep0[4] >> 4]
                         + (uint)lzma_rc_prices[(ulong)(coder->is_rep0_long[4][uVar26] >> 4) ^ 0x7f]
                ;
                if (uVar26 < coder->opts[uVar34].price) {
                  coder->opts[uVar34].price = uVar26;
                  coder->opts[uVar34].pos_prev = uVar39 + 1;
                  coder->opts[uVar34].back_prev = 0;
                  coder->opts[uVar34].prev_1_is_literal = true;
                  coder->opts[uVar34].prev_2 = true;
                  coder->opts[uVar34].pos_prev_2 = uVar14;
                  coder->opts[uVar34].back_prev_2 = (int)local_128 + 4;
                }
              }
              uVar34 = (int)uVar48 + 1;
              uVar48 = (ulong)uVar34;
              bVar49 = uVar34 != local_120;
            }
            uVar32 = uVar32 + 1;
          } while (bVar49);
        }
      }
      lVar40 = local_90 + 1;
      local_110 = (ulong)((int)local_110 - 1);
      uVar48 = local_98;
    } while (local_98 < local_198);
  }
  coder->opts_end_index = (uint32_t)uVar48;
  uVar27 = coder->opts[uVar48 & 0xffffffff].pos_prev;
  uVar14 = coder->opts[uVar48 & 0xffffffff].back_prev;
  do {
    uVar18 = (ulong)uVar27;
    uVar47 = uVar48 & 0xffffffff;
    if (coder->opts[uVar47].prev_1_is_literal == true) {
      coder->opts[uVar18].back_prev = 0xffffffff;
      coder->opts[uVar18].prev_1_is_literal = false;
      uVar45 = uVar27 - 1;
      coder->opts[uVar18].pos_prev = uVar45;
      if (coder->opts[uVar47].prev_2 == true) {
        coder->opts[uVar45].prev_1_is_literal = false;
        coder->opts[uVar45].pos_prev = coder->opts[uVar47].pos_prev_2;
        coder->opts[uVar45].back_prev = coder->opts[uVar47].back_prev_2;
      }
    }
    uVar45 = coder->opts[uVar18].pos_prev;
    uVar31 = coder->opts[uVar18].back_prev;
    coder->opts[uVar18].back_prev = uVar14;
    coder->opts[uVar18].pos_prev = (uint32_t)uVar48;
    bVar49 = uVar27 != 0;
    uVar48 = uVar18;
    uVar27 = uVar45;
    uVar14 = uVar31;
  } while (bVar49);
  uVar27 = coder->opts[0].pos_prev;
  coder->opts_current_index = uVar27;
  *local_138 = uVar27;
  uVar31 = coder->opts[0].back_prev;
LAB_004ac089:
  *local_130 = uVar31;
  return;
}

Assistant:

extern void
lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res,
		uint32_t position)
{
	// If we have symbols pending, return the next pending symbol.
	if (coder->opts_end_index != coder->opts_current_index) {
		assert(mf->read_ahead > 0);
		*len_res = coder->opts[coder->opts_current_index].pos_prev
				- coder->opts_current_index;
		*back_res = coder->opts[coder->opts_current_index].back_prev;
		coder->opts_current_index = coder->opts[
				coder->opts_current_index].pos_prev;
		return;
	}

	// Update the price tables. In LZMA SDK <= 4.60 (and possibly later)
	// this was done in both initialization function and in the main loop.
	// In liblzma they were moved into this single place.
	if (mf->read_ahead == 0) {
		if (coder->match_price_count >= (1 << 7))
			fill_dist_prices(coder);

		if (coder->align_price_count >= ALIGN_SIZE)
			fill_align_prices(coder);
	}

	// TODO: This needs quite a bit of cleaning still. But splitting
	// the original function into two pieces makes it at least a little
	// more readable, since those two parts don't share many variables.

	uint32_t len_end = helper1(coder, mf, back_res, len_res, position);
	if (len_end == UINT32_MAX)
		return;

	uint32_t reps[REPS];
	memcpy(reps, coder->reps, sizeof(reps));

	uint32_t cur;
	for (cur = 1; cur < len_end; ++cur) {
		assert(cur < OPTS);

		coder->longest_match_length = mf_find(
				mf, &coder->matches_count, coder->matches);

		if (coder->longest_match_length >= mf->nice_len)
			break;

		len_end = helper2(coder, reps, mf_ptr(mf) - 1, len_end,
				position + cur, cur, mf->nice_len,
				my_min(mf_avail(mf) + 1, OPTS - 1 - cur));
	}

	backward(coder, len_res, back_res, cur);
	return;
}